

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O3

int readImmediate(InternalInstruction *insn,uint8_t size)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ulong in_RAX;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  uint offset;
  long lVar7;
  uint8_t imm8;
  uint8_t byte_1;
  uint8_t byte;
  uint8_t byte_2;
  undefined8 uStack_38;
  
  bVar2 = insn->numImmediatesConsumed;
  if (bVar2 == 2) {
    return -1;
  }
  if (size == '\0') {
    size = insn->immediateSize;
  }
  else {
    insn->immediateSize = size;
  }
  insn->immediateOffset = (char)insn->readerCursor - (char)(int)insn->startLocation;
  uStack_38 = in_RAX;
  switch(size) {
  case '\x01':
    iVar3 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)((long)&uStack_38 + 4),
                            insn->readerCursor);
    if (iVar3 != 0) {
      return -1;
    }
    insn->readerCursor = insn->readerCursor + 1;
    uVar6 = uStack_38 >> 0x20 & 0xff;
    break;
  case '\x02':
    lVar7 = 0;
    uVar5 = 0;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      iVar3 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)((long)&uStack_38 + 5),
                              insn->readerCursor + lVar7);
      if (iVar3 != 0) {
        return -1;
      }
      uVar5 = uVar5 | (uint)uStack_38._5_1_ << (sbyte)((int)lVar7 << 3);
      lVar7 = 1;
      bVar1 = false;
    } while (bVar4);
    insn->readerCursor = insn->readerCursor + 2;
    uVar6 = (ulong)(uVar5 & 0xffff);
    break;
  default:
    goto switchD_001a080a_caseD_3;
  case '\x04':
    bVar2 = 0;
    lVar7 = 0;
    uVar5 = 0;
    do {
      iVar3 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)((long)&uStack_38 + 6),
                              insn->readerCursor + lVar7);
      if (iVar3 != 0) {
        return -1;
      }
      uVar5 = uVar5 | (uint)uStack_38._6_1_ << (bVar2 & 0x3f);
      lVar7 = lVar7 + 1;
      bVar2 = bVar2 + 8;
    } while (lVar7 != 4);
    insn->readerCursor = insn->readerCursor + 4;
    uVar6 = (ulong)uVar5;
    break;
  case '\b':
    bVar2 = 0;
    lVar7 = 0;
    uVar6 = 0;
    do {
      iVar3 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)((long)&uStack_38 + 7),
                              insn->readerCursor + lVar7);
      if (iVar3 != 0) {
        return -1;
      }
      uVar6 = uVar6 | (uStack_38 >> 0x38) << (bVar2 & 0x3f);
      lVar7 = lVar7 + 1;
      bVar2 = bVar2 + 8;
    } while (lVar7 != 8);
    insn->readerCursor = insn->readerCursor + 8;
  }
  bVar2 = insn->numImmediatesConsumed;
  insn->immediates[bVar2] = uVar6;
switchD_001a080a_caseD_3:
  insn->numImmediatesConsumed = bVar2 + 1;
  return 0;
}

Assistant:

static int readImmediate(struct InternalInstruction *insn, uint8_t size)
{
	uint8_t imm8;
	uint16_t imm16;
	uint32_t imm32;
	uint64_t imm64;

	// dbgprintf(insn, "readImmediate()");

	if (insn->numImmediatesConsumed == 2) {
		//debug("Already consumed two immediates");
		return -1;
	}

	if (size == 0)
		size = insn->immediateSize;
	else
		insn->immediateSize = size;
	insn->immediateOffset = (uint8_t)(insn->readerCursor - insn->startLocation);

	switch (size) {
		case 1:
			if (consumeByte(insn, &imm8))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm8;
			break;
		case 2:
			if (consumeUInt16(insn, &imm16))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm16;
			break;
		case 4:
			if (consumeUInt32(insn, &imm32))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm32;
			break;
		case 8:
			if (consumeUInt64(insn, &imm64))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm64;
			break;
	}

	insn->numImmediatesConsumed++;

	return 0;
}